

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O1

double __thiscall chrono::utils::MixtureIngredient::getDensity(MixtureIngredient *this)

{
  double dVar1;
  double dVar2;
  normal_distribution<double> *this_00;
  int iVar3;
  double dVar4;
  
  this_00 = this->m_densityDist;
  if (this_00 == (normal_distribution<double> *)0x0) {
    dVar4 = this->m_defDensity;
  }
  else {
    dVar1 = this->m_minDensity;
    dVar2 = this->m_maxDensity;
    do {
      if ((rengine()::re == '\0') && (iVar3 = __cxa_guard_acquire(&rengine()::re), iVar3 != 0)) {
        rengine()::re =
             (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             ::operator_new(8);
        rengine()::re->_M_x = 1;
        __cxa_guard_release(&rengine()::re);
      }
      dVar4 = std::normal_distribution<double>::operator()(this_00,rengine()::re,&this_00->_M_param)
      ;
    } while ((dVar4 < dVar1) || (dVar2 < dVar4));
  }
  return dVar4;
}

Assistant:

double MixtureIngredient::getDensity() {
    if (m_densityDist)
        return sampleTruncatedDist<double>(*m_densityDist, m_minDensity, m_maxDensity);

    return m_defDensity;
}